

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O3

void __thiscall duckdb::ScanFilterInfo::SetFilterAlwaysTrue(ScanFilterInfo *this,idx_t filter_idx)

{
  ulong *puVar1;
  ulong uVar2;
  byte bVar3;
  reference pvVar4;
  ulong uVar5;
  
  pvVar4 = vector<duckdb::ScanFilter,_true>::operator[](&this->filter_list,filter_idx);
  if (pvVar4->always_true == false) {
    pvVar4->always_true = true;
    uVar2 = pvVar4->scan_column_index;
    uVar5 = uVar2 + 0x3f;
    if (-1 < (long)uVar2) {
      uVar5 = uVar2;
    }
    bVar3 = (byte)uVar2 & 0x3f;
    puVar1 = (ulong *)(((long)uVar5 >> 6) * 8 +
                       (long)(this->column_has_filter).super_vector<bool,_std::allocator<bool>_>.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + -8 +
                      (ulong)((uVar2 & 0x800000000000003f) < 0x8000000000000001) * 8);
    *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
    this->always_true_filters = this->always_true_filters + 1;
  }
  return;
}

Assistant:

void ScanFilterInfo::SetFilterAlwaysTrue(idx_t filter_idx) {
	auto &filter = filter_list[filter_idx];
	if (filter.always_true) {
		return;
	}
	filter.always_true = true;
	column_has_filter[filter.scan_column_index] = false;
	always_true_filters++;
}